

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonBlobEdit(JsonParse *pParse,u32 iDel,u32 nDel,u8 *aIns,u32 nIns)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (nIns != nDel) {
    lVar3 = (ulong)nIns - (ulong)nDel;
    lVar1 = (ulong)pParse->nBlob + lVar3;
    if (((long)(ulong)pParse->nBlobAlloc < lVar1) &&
       (jsonBlobExpand(pParse,(u32)lVar1), pParse->oom != '\0')) {
      return;
    }
    memmove(pParse->aBlob + (iDel + nIns),pParse->aBlob + (nDel + iDel),
            (ulong)(pParse->nBlob - (nDel + iDel)));
    iVar2 = (int)lVar3;
    pParse->nBlob = pParse->nBlob + iVar2;
    pParse->delta = pParse->delta + iVar2;
  }
  if (aIns == (u8 *)0x0 || nIns == 0) {
    return;
  }
  memcpy(pParse->aBlob + iDel,aIns,(ulong)nIns);
  return;
}

Assistant:

static void jsonBlobEdit(
  JsonParse *pParse,     /* The JSONB to be modified is in pParse->aBlob */
  u32 iDel,              /* First byte to be removed */
  u32 nDel,              /* Number of bytes to remove */
  const u8 *aIns,        /* Content to insert */
  u32 nIns               /* Bytes of content to insert */
){
  i64 d = (i64)nIns - (i64)nDel;
  if( d!=0 ){
    if( pParse->nBlob + d > pParse->nBlobAlloc ){
      jsonBlobExpand(pParse, pParse->nBlob+d);
      if( pParse->oom ) return;
    }
    memmove(&pParse->aBlob[iDel+nIns],
            &pParse->aBlob[iDel+nDel],
            pParse->nBlob - (iDel+nDel));
    pParse->nBlob += d;
    pParse->delta += d;
  }
  if( nIns && aIns ) memcpy(&pParse->aBlob[iDel], aIns, nIns);
}